

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
RobotDynamics::getTau
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RobotDynamics *this,
          double G,vector<Eigen::Quaternion<double,_0>,_std::allocator<Eigen::Quaternion<double,_0>_>_>
                   *q,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *P,vector<double,_std::allocator<double>_> *theta_d,
          vector<double,_std::allocator<double>_> *theta_dd)

{
  size_type sVar1;
  reference r;
  Matrix<double,3,3,0,3,3> *this_00;
  vector<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_a0;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_88;
  uint local_70;
  int i;
  uint local_5c;
  undefined1 local_58 [4];
  uint len;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  R;
  vector<double,_std::allocator<double>_> *theta_dd_local;
  vector<double,_std::allocator<double>_> *theta_d_local;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *P_local;
  vector<Eigen::Quaternion<double,_0>,_std::allocator<Eigen::Quaternion<double,_0>_>_> *q_local;
  double G_local;
  RobotDynamics *this_local;
  
  R.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)theta_dd;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)local_58);
  sVar1 = std::vector<Eigen::Quaternion<double,_0>,_std::allocator<Eigen::Quaternion<double,_0>_>_>
          ::size(q);
  local_5c = (uint)sVar1;
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::resize((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)local_58,sVar1 & 0xffffffff);
  for (local_70 = 0; local_70 < local_5c; local_70 = local_70 + 1) {
    r = std::vector<Eigen::Quaternion<double,_0>,_std::allocator<Eigen::Quaternion<double,_0>_>_>::
        operator[](q,(long)(int)local_70);
    this_00 = (Matrix<double,3,3,0,3,3> *)
              std::
              vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                            *)local_58,(long)(int)local_70);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              (this_00,(RotationBase<Eigen::Quaternion<double,_0>,_3> *)r);
  }
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector(&local_88,
           (vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)local_58);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_a0,P);
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,theta_d);
  std::vector<double,_std::allocator<double>_>::vector(&local_d0,theta_dd);
  getTau(__return_storage_ptr__,this,G,&local_88,&local_a0,&local_b8,&local_d0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_d0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_b8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector(&local_a0);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector(&local_88);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<double> RobotDynamics::
getTau(double G, vector<Eigen::Quaterniond> q, vector<Eigen::Vector3d> P,
       vector<double> theta_d, vector<double> theta_dd)
{
    vector<Eigen::Matrix3d> R;
    unsigned int len = q.size();
    R.resize(len);
    for (int i = 0; i < len; i++)
    {
        R[i] = q[i];
    }
    return getTau(G, R, P, theta_d, theta_dd);
}